

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O2

int __thiscall Fl_Tree_Item_Array::move(Fl_Tree_Item_Array *this,int to,int from)

{
  Fl_Tree_Item *pFVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int r;
  long lVar5;
  
  iVar4 = 0;
  if ((((from != to) && (iVar4 = -1, -1 < to)) && (iVar2 = this->_total, from < iVar2)) &&
     ((-1 < from && (to < iVar2)))) {
    uVar3 = (ulong)(uint)from;
    pFVar1 = this->_items[uVar3];
    if ((uint)from < (uint)to) {
      for (; (from < to && (from <= iVar2)); from = from + 1) {
        this->_items[uVar3] = this->_items[uVar3 + 1];
        iVar2 = this->_total;
        uVar3 = uVar3 + 1;
      }
    }
    else {
      for (; to < from; from = from - 1) {
        this->_items[(uint)from] = this->_items[(ulong)(uint)from - 1];
      }
    }
    this->_items[(uint)to] = pFVar1;
    iVar4 = 0;
    for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
      Fl_Tree_Item::update_prev_next(this->_items[lVar5],(int)lVar5);
      iVar2 = this->_total;
    }
  }
  return iVar4;
}

Assistant:

int Fl_Tree_Item_Array::move(int to, int from) {
  if ( from == to ) return 0;    // nop
  if ( to<0 || to>=_total || from<0 || from>=_total ) return -1;
  Fl_Tree_Item *item = _items[from];
  // Remove item..
  if ( from < to )
    for ( int t=from; t<to && t<(_total+1); t++ )
      _items[t] = _items[t+1];
  else
    for ( int t=from; t>to && t>0; t-- )
      _items[t] = _items[t-1];
  // Move to new position
  _items[to] = item;
  // Update all children
  for ( int r=0; r<_total; r++ )	// XXX: excessive to do all children,
    _items[r]->update_prev_next(r);	// XXX: but avoids weird boundary issues
  return 0;
}